

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int ll_require(lua_State *L)

{
  int iVar1;
  char *k;
  long n;
  luaL_Buffer local_2050;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_settop(L,1);
  lua_getfield(L,-0xf4628,"_LOADED");
  lua_getfield(L,2,k);
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    luaL_buffinit(L,&local_2050);
    iVar1 = lua_getfield(L,-0xf4629,"searchers");
    if (iVar1 != 5) {
      luaL_error(L,"\'package.searchers\' must be a table");
    }
    n = 1;
    while( true ) {
      iVar1 = lua_rawgeti(L,3,n);
      if (iVar1 == 0) {
        lua_settop(L,-2);
        luaL_pushresult(&local_2050);
        lua_tolstring(L,-1,(size_t *)0x0);
        luaL_error(L,"module \'%s\' not found:%s",k);
      }
      lua_pushstring(L,k);
      lua_callk(L,1,2,0,(lua_KFunction)0x0);
      iVar1 = lua_type(L,-2);
      if (iVar1 == 6) break;
      iVar1 = lua_isstring(L,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        lua_settop(L,-2);
        luaL_addvalue(&local_2050);
      }
      n = n + 1;
    }
    lua_pushstring(L,k);
    lua_rotate(L,-2,1);
    lua_callk(L,2,1,0,(lua_KFunction)0x0);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      lua_setfield(L,2,k);
    }
    iVar1 = lua_getfield(L,2,k);
    if (iVar1 == 0) {
      lua_pushboolean(L,1);
      lua_pushvalue(L,-1);
      lua_setfield(L,2,k);
    }
  }
  return 1;
}

Assistant:

static int ll_require (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  lua_settop(L, 1);  /* _LOADED table will be at index 2 */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, 2, name);  /* _LOADED[name] */
  if (lua_toboolean(L, -1))  /* is it there? */
    return 1;  /* package is already loaded */
  /* else must load package */
  lua_pop(L, 1);  /* remove 'getfield' result */
  findloader(L, name);
  lua_pushstring(L, name);  /* pass name as argument to module loader */
  lua_insert(L, -2);  /* name is 1st argument (before search data) */
  lua_call(L, 2, 1);  /* run loader to load module */
  if (!lua_isnil(L, -1))  /* non-nil return? */
    lua_setfield(L, 2, name);  /* _LOADED[name] = returned value */
  if (lua_getfield(L, 2, name) == LUA_TNIL) {   /* module set no value? */
    lua_pushboolean(L, 1);  /* use true as result */
    lua_pushvalue(L, -1);  /* extra copy to be returned */
    lua_setfield(L, 2, name);  /* _LOADED[name] = true */
  }
  return 1;
}